

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O2

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)1,_(CPU::MOS6502Esque::Type)5>
::perform_special_key
          (ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)1,_(CPU::MOS6502Esque::Type)5>
           *this,Key key)

{
  int *piVar1;
  size_t in_RCX;
  uint uVar2;
  int iVar3;
  undefined6 in_register_00000032;
  
  iVar3 = (int)CONCAT62(in_register_00000032,key);
  if (iVar3 == 0xfffd) {
    uVar2 = 8;
  }
  else {
    if (iVar3 != 0xfffc) {
      return;
    }
    Jasmin::write(&this->jasmin_,0x3fa,(void *)0x0,in_RCX);
    uVar2 = 1;
    Jasmin::write(&this->jasmin_,0x3fb,(void *)0x1,in_RCX);
  }
  piVar1 = &(this->m6502_).
            super_Processor<Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)1,_(CPU::MOS6502Esque::Type)5>,_false>
            .super_ProcessorBase.super_ProcessorStorage.pending_exceptions_;
  *piVar1 = *piVar1 | uVar2;
  return;
}

Assistant:

void perform_special_key(Oric::Key key) final {
			switch(key) {
				default: break;

				case KeyJasminReset:
					jasmin_.write(0x3fa, 0);
					jasmin_.write(0x3fb, 1);
					m6502_.set_power_on(true);
				break;

				case KeyNMI:
					// As luck would have it, the 6502's NMI line is edge triggered.
					// So just forcing through an edge will work here.
					m6502_.set_nmi_line(true);
					m6502_.set_nmi_line(false);
				break;
			}
		}